

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O0

uint64_t google::protobuf::internal::ThreadSafeArena::GetNextLifeCycleId(void)

{
  ThreadCache *pTVar1;
  uint64_t kInc;
  uint64_t id;
  ThreadCache *tc;
  
  pTVar1 = thread_cache();
  kInc = pTVar1->next_lifecycle_id;
  if ((kInc & 0xff) == 0) {
    LOCK();
    UNLOCK();
    kInc = lifecycle_id_ << 8;
    lifecycle_id_ = lifecycle_id_ + 1;
  }
  pTVar1->next_lifecycle_id = kInc + 1;
  return kInc;
}

Assistant:

uint64_t ThreadSafeArena::GetNextLifeCycleId() {
  ThreadCache& tc = thread_cache();
  uint64_t id = tc.next_lifecycle_id;
  constexpr uint64_t kInc = ThreadCache::kPerThreadIds;
  if (PROTOBUF_PREDICT_FALSE((id & (kInc - 1)) == 0)) {
    // On platforms that don't support uint64_t atomics we can certainly not
    // afford to increment by large intervals and expect uniqueness due to
    // wrapping, hence we only add by 1.
    id = lifecycle_id_.fetch_add(1, std::memory_order_relaxed) * kInc;
  }
  tc.next_lifecycle_id = id + 1;
  return id;
}